

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
contains_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::contains_validator
          (contains_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *schema,
          uri *schema_location,string *custom_message,schema_validator_ptr_type *schema_validator,
          unique_ptr<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          *max_contains,
          unique_ptr<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          *min_contains)

{
  allocator<char> local_51;
  string local_50;
  
  *(undefined ***)&this->field_0xf8 = &PTR__validator_base_009a42b8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"contains",&local_51);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::keyword_validator(&this->
                       super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      ,&PTR_construction_vtable_24__009a4e28,&local_50,schema,schema_location,
                      custom_message);
  std::__cxx11::string::~string((string *)&local_50);
  (this->
  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ).
  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  .super_validation_message_factory._vptr_validation_message_factory = (_func_int **)0x9a4d60;
  *(undefined8 *)&this->field_0xf8 = 0x9a4de8;
  *(schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    **)&(this->
        super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ).field_0xe0 =
       (schema_validator->_M_t).
       super___uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
       .
       super__Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
       ._M_head_impl;
  (schema_validator->_M_t).
  super___uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        *)0x0;
  (this->max_contains_)._M_t.
  super___uniq_ptr_impl<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (max_contains->_M_t).
       super___uniq_ptr_impl<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
       .
       super__Head_base<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
       ._M_head_impl;
  (max_contains->_M_t).
  super___uniq_ptr_impl<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        *)0x0;
  (this->min_contains_)._M_t.
  super___uniq_ptr_impl<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (min_contains->_M_t).
       super___uniq_ptr_impl<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
       .
       super__Head_base<0UL,_jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
       ._M_head_impl;
  (min_contains->_M_t).
  super___uniq_ptr_impl<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        *)0x0;
  return;
}

Assistant:

contains_validator(const Json& schema, const uri& schema_location, const std::string& custom_message,
            schema_validator_ptr_type&& schema_validator,
            std::unique_ptr<max_contains_keyword<Json>>&& max_contains,
            std::unique_ptr<min_contains_keyword<Json>>&& min_contains)
            : keyword_validator<Json>("contains", schema, std::move(schema_location), custom_message), 
              schema_validator_(std::move(schema_validator)),
              max_contains_(std::move(max_contains)),
              min_contains_(std::move(min_contains))
        {
        }